

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite_correlated_expressions.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::RewriteCountAggregates::VisitReplace
          (RewriteCountAggregates *this,BoundColumnRefExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  iterator iVar1;
  BoundOperatorExpression *this_00;
  pointer pBVar2;
  BoundConstantExpression *this_01;
  _Head_base<0UL,_duckdb::Expression_*,_false> *in_RCX;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_c0;
  _Head_base<0UL,_duckdb::BoundOperatorExpression_*,_false> local_b8;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_b0;
  Value local_a8;
  Value local_68;
  
  iVar1 = ::std::
          _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(*(_Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   **)&(expr->super_Expression).super_BaseExpression.type,
                 (key_type *)(expr_ptr + 0xb));
  if (iVar1.super__Node_iterator_base<std::pair<const_duckdb::ColumnBinding,_unsigned_long>,_true>.
      _M_cur == (__node_type *)0x0) {
    (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor = (_func_int **)0x0;
  }
  else {
    this_00 = (BoundOperatorExpression *)operator_new(0x70);
    LogicalType::LogicalType(&local_a8.type_,BOOLEAN);
    BoundOperatorExpression::BoundOperatorExpression(this_00,OPERATOR_IS_NULL,&local_a8.type_);
    local_c0._M_head_impl = this_00;
    LogicalType::~LogicalType(&local_a8.type_);
    pBVar2 = unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                           *)&local_c0);
    (*(code *)(expr_ptr->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl[1].
              super_BaseExpression.query_location.index)(&local_a8,expr_ptr);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar2->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_a8);
    if ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
        local_a8.type_._0_8_ !=
        (__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0) {
      (**(code **)(*(long *)local_a8.type_._0_8_ + 8))();
    }
    local_b8._M_head_impl = local_c0._M_head_impl;
    local_c0._M_head_impl = (BoundOperatorExpression *)0x0;
    Value::Numeric(&local_68,(LogicalType *)(expr_ptr + 7),0);
    this_01 = (BoundConstantExpression *)operator_new(0x98);
    Value::Value(&local_a8,&local_68);
    BoundConstantExpression::BoundConstantExpression(this_01,&local_a8);
    local_b0._M_head_impl = this_01;
    Value::~Value(&local_a8);
    Value::~Value(&local_68);
    local_a8.type_._0_8_ = in_RCX->_M_head_impl;
    in_RCX->_M_head_impl = (Expression *)0x0;
    make_uniq<duckdb::BoundCaseExpression,duckdb::unique_ptr<duckdb::BoundOperatorExpression,std::default_delete<duckdb::BoundOperatorExpression>,true>,duckdb::unique_ptr<duckdb::BoundConstantExpression,std::default_delete<duckdb::BoundConstantExpression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((duckdb *)&local_68,
               (unique_ptr<duckdb::BoundOperatorExpression,_std::default_delete<duckdb::BoundOperatorExpression>,_true>
                *)&local_b8,
               (unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                *)&local_b0,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_a8);
    (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
         (_func_int **)local_68.type_._0_8_;
    if ((tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)local_a8.type_._0_8_
        != (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (**(code **)(*(long *)local_a8.type_._0_8_ + 8))();
    }
    if (local_b0._M_head_impl != (BoundConstantExpression *)0x0) {
      (*((local_b0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    if (local_b8._M_head_impl != (BoundOperatorExpression *)0x0) {
      (*((local_b8._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    if (local_c0._M_head_impl != (BoundOperatorExpression *)0x0) {
      (*((local_c0._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
  }
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> RewriteCountAggregates::VisitReplace(BoundColumnRefExpression &expr,
                                                            unique_ptr<Expression> *expr_ptr) {
	auto entry = replacement_map.find(expr.binding);
	if (entry != replacement_map.end()) {
		// reference to a COUNT(*) aggregate
		// replace this with CASE WHEN COUNT(*) IS NULL THEN 0 ELSE COUNT(*) END
		auto is_null = make_uniq<BoundOperatorExpression>(ExpressionType::OPERATOR_IS_NULL, LogicalType::BOOLEAN);
		is_null->children.push_back(expr.Copy());
		auto check = std::move(is_null);
		auto result_if_true = make_uniq<BoundConstantExpression>(Value::Numeric(expr.return_type, 0));
		auto result_if_false = std::move(*expr_ptr);
		return make_uniq<BoundCaseExpression>(std::move(check), std::move(result_if_true), std::move(result_if_false));
	}
	return nullptr;
}